

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O0

int nn_excl_add(nn_excl *self,nn_pipe *pipe)

{
  nn_pipe *pipe_local;
  nn_excl *self_local;
  int local_4;
  
  if (self->pipe == (nn_pipe *)0x0) {
    self->pipe = pipe;
    local_4 = 0;
  }
  else {
    local_4 = -0x6a;
  }
  return local_4;
}

Assistant:

int nn_excl_add (struct nn_excl *self, struct nn_pipe *pipe)
{
    /*  If there's a connection being used, reject any new connection. */
    if (self->pipe)
        return -EISCONN;

    /*  Remember that this pipe is the active one. */
    self->pipe = pipe;

    return 0;
}